

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd_array.c
# Opt level: O2

nsh_status_t nsh_cmd_array_register(nsh_cmd_array_t *cmds,char *name,nsh_cmd_handler_t *handler)

{
  if (0x1f < (ulong)cmds->count) {
    return NSH_STATUS_MAX_CMD_NB_REACH;
  }
  nsh_cmd_init(cmds->array + cmds->count,name,handler);
  cmds->count = cmds->count + 1;
  return NSH_STATUS_OK;
}

Assistant:

nsh_status_t nsh_cmd_array_register(nsh_cmd_array_t* cmds, const char* name, nsh_cmd_handler_t* handler)
{
    if (cmds->count >= NSH_CMD_MAX_COUNT) {
        // If we have reached the max cmd count, ignore all registration request
        return NSH_STATUS_MAX_CMD_NB_REACH;
    }

    nsh_cmd_init(&cmds->array[cmds->count], name, handler);

    cmds->count++;

    return NSH_STATUS_OK;
}